

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  _Alloc_hider _Var8;
  GeneratorExpressionContent *content_00;
  bool bVar9;
  string result;
  cmGeneratorTarget *target;
  string name;
  string local_b8;
  string local_98;
  cmGeneratorTarget *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  content_00 = content;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
  bVar3 = cmGeneratorExpression::IsValidTargetName(&local_50);
  if (bVar3) {
    local_78 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_50);
    if (local_78 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
      std::operator+(&local_70,"No target \"",&local_50);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      reportError(context,&local_98,&local_b8);
LAB_0044c38e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      _Var8._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_0044c3b7;
      goto LAB_0044c3bf;
    }
    TVar4 = cmGeneratorTarget::GetType(local_78);
    if ((3 < (int)TVar4) && (TVar4 = cmGeneratorTarget::GetType(local_78), TVar4 != UNKNOWN_LIBRARY)
       ) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
      std::operator+(&local_70,"Target \"",&local_50);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      reportError(context,&local_98,&local_b8);
      goto LAB_0044c38e;
    }
    if (dagChecker == (cmGeneratorExpressionDAGChecker *)0x0) {
LAB_0044c209:
      bVar3 = false;
LAB_0044c20c:
      bVar9 = false;
    }
    else {
      bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagChecker,local_50._M_dataplus._M_p);
      if (!bVar3) {
        bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
        if (!bVar3) goto LAB_0044c209;
        cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_(&local_98,dagChecker);
        if (local_50._M_string_length == local_98._M_string_length) {
          bVar3 = true;
          if (local_50._M_string_length == 0) {
            bVar9 = true;
          }
          else {
            iVar5 = bcmp(local_50._M_dataplus._M_p,local_98._M_dataplus._M_p,
                         local_50._M_string_length);
            bVar9 = iVar5 == 0;
          }
          goto LAB_0044c20f;
        }
        bVar3 = true;
        goto LAB_0044c20c;
      }
      bVar9 = true;
      bVar3 = false;
    }
LAB_0044c20f:
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2)) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (!bVar9) {
      std::
      _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
      ::_M_insert_unique<cmGeneratorTarget*const&>
                ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                  *)&context->DependTargets,&local_78);
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->AllTargets,&local_78);
      TargetFilesystemArtifactResultCreator<ArtifactLinkerTag>::Create_abi_cxx11_
                (&local_b8,(TargetFilesystemArtifactResultCreator<ArtifactLinkerTag> *)local_78,
                 (cmGeneratorTarget *)context,(cmGeneratorExpressionContext *)content,content_00);
      if (context->HadError == true) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_b8._M_dataplus._M_p,
                   local_b8._M_dataplus._M_p + local_b8._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0044c3ed;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "Expressions which require the linker language may not be used while evaluating link libraries"
               ,"");
    reportError(context,&local_b8,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_98.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    local_98._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_0044c3d2;
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_98,content);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Expression syntax not recognized.","");
    reportError(context,&local_98,&local_b8);
    local_70.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    _Var8._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_0044c3b7:
      operator_delete(_Var8._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
LAB_0044c3bf:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_0044c3d2:
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0044c3ed:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* context,
                       const GeneratorExpressionContent* content,
                       cmGeneratorExpressionDAGChecker* dagChecker) const
    CM_OVERRIDE
  {
    // Lookup the referenced target.
    std::string name = *parameters.begin();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(), "Target \"" +
                      name + "\" is not an executable or library.");
      return std::string();
    }
    if (dagChecker && (dagChecker->EvaluatingLinkLibraries(name.c_str()) ||
                       (dagChecker->EvaluatingSources() &&
                        name == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }